

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O3

void slang::ast::NetSymbol::fromSyntax
               (Scope *scope,NetDeclarationSyntax *syntax,
               SmallVectorBase<const_slang::ast::NetSymbol_*> *results)

{
  Token *this;
  undefined1 *puVar1;
  TokenKind TVar2;
  Compilation *this_00;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  SmallVectorBase<const_slang::ast::NetSymbol_*> *this_01;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar3;
  NetSymbol *this_02;
  ExpansionHint EVar4;
  long lVar5;
  ulong uVar6;
  NetSymbol *net;
  string_view local_60;
  SmallVectorBase<const_slang::ast::NetSymbol_*> *local_50;
  NetType *local_48;
  DeclaratorSyntax *local_40;
  SourceLocation local_38;
  
  this_00 = scope->compilation;
  local_48 = Compilation::getNetType(this_00,(syntax->netType).kind);
  TVar2 = (syntax->expansionHint).kind;
  EVar4 = Vectored;
  if (TVar2 != VectoredKeyword) {
    EVar4 = (uint)(TVar2 == ScalaredKeyword) * 2;
  }
  uVar6 = (syntax->declarators).elements._M_extent._M_extent_value + 1;
  if (1 < uVar6) {
    uVar6 = uVar6 >> 1;
    lVar5 = 0;
    local_50 = results;
    do {
      ppSVar3 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->declarators).elements._M_ptr)->
                                   super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar5));
      local_40 = (DeclaratorSyntax *)*ppSVar3;
      this = &local_40->name;
      local_60 = parsing::Token::valueText(this);
      local_38 = parsing::Token::location(this);
      this_02 = BumpAllocator::
                emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
                          (&this_00->super_BumpAllocator,&local_60,&local_38,local_48);
      this_01 = local_50;
      local_60._M_len = (size_t)this_02;
      this_02->expansionHint = EVar4;
      (this_02->super_ValueSymbol).declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(syntax->type).ptr;
      puVar1 = &(this_02->super_ValueSymbol).declaredType.field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      ValueSymbol::setFromDeclarator(&this_02->super_ValueSymbol,local_40);
      syntax_00._M_ptr =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
      syntax_00._M_extent._M_extent_value =
           (syntax->super_MemberSyntax).attributes.
           super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
           _M_extent_value;
      Symbol::setAttributes((Symbol *)local_60._M_len,scope,syntax_00);
      SmallVectorBase<slang::ast::NetSymbol_const*>::
      emplace_back<slang::ast::NetSymbol_const*const&>
                ((SmallVectorBase<slang::ast::NetSymbol_const*> *)this_01,(NetSymbol **)&local_60);
      lVar5 = lVar5 + 0x30;
      uVar6 = uVar6 - 1;
    } while (uVar6 != 0);
  }
  return;
}

Assistant:

void NetSymbol::fromSyntax(const Scope& scope, const NetDeclarationSyntax& syntax,
                           SmallVectorBase<const NetSymbol*>& results) {
    auto& comp = scope.getCompilation();
    const NetType& netType = comp.getNetType(syntax.netType.kind);

    ExpansionHint expansionHint = ExpansionHint::None;
    switch (syntax.expansionHint.kind) {
        case TokenKind::VectoredKeyword:
            expansionHint = ExpansionHint::Vectored;
            break;
        case TokenKind::ScalaredKeyword:
            expansionHint = ExpansionHint::Scalared;
            break;
        default:
            break;
    }

    for (auto declarator : syntax.declarators) {
        auto net = comp.emplace<NetSymbol>(declarator->name.valueText(),
                                           declarator->name.location(), netType);
        net->expansionHint = expansionHint;
        net->setDeclaredType(*syntax.type);
        net->setFromDeclarator(*declarator);
        net->setAttributes(scope, syntax.attributes);
        results.push_back(net);
    }
}